

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

Vec_Int_t * Vec_IntStart(int nSize)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nCap = 0x10;
  pVVar1->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  pVVar1->pArray = piVar2;
  pVVar1->nSize = 1;
  if (piVar2 != (int *)0x0) {
    *piVar2 = 0;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStart( int nSize )
{
    Vec_Int_t * p;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    if ( p->pArray ) memset( p->pArray, 0, sizeof(int) * (size_t)nSize );
    return p;
}